

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Parser.cpp
# Opt level: O0

unique_ptr<StatementNode,_std::default_delete<StatementNode>_> __thiscall
Parser::parseReturnStatement(Parser *this)

{
  Mark *pMVar1;
  Token *this_00;
  pointer this_01;
  Tokenizer *in_RSI;
  StatementNode *in_RDI;
  Parser *in_stack_00000028;
  __single_object node;
  unique_ptr<ExpressionNode,_std::default_delete<ExpressionNode>_> value;
  Mark mark;
  unique_ptr<ExpressionNode,_std::default_delete<ExpressionNode>_> *in_stack_ffffffffffffff38;
  unique_ptr<ExpressionNode,_std::default_delete<ExpressionNode>_> *in_stack_ffffffffffffff40;
  _Head_base<0UL,_StatementNode_*,_false> this_02;
  allocator<char> *in_stack_ffffffffffffff70;
  unique_ptr<ExpressionNode,_std::default_delete<ExpressionNode>_> *in_stack_ffffffffffffff78;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff80;
  string *in_stack_ffffffffffffffc0;
  string local_38 [4];
  TokenType in_stack_ffffffffffffffcc;
  Parser *in_stack_ffffffffffffffd0;
  Mark this_03;
  
  this_02._M_head_impl = in_RDI;
  pMVar1 = Tokenizer::getMark((Tokenizer *)0x16f596);
  this_03 = *pMVar1;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_ffffffffffffff80,(char *)in_stack_ffffffffffffff78,in_stack_ffffffffffffff70);
  expectToken(in_stack_ffffffffffffffd0,in_stack_ffffffffffffffcc,in_stack_ffffffffffffffc0);
  std::__cxx11::string::~string(local_38);
  std::allocator<char>::~allocator((allocator<char> *)&stack0xffffffffffffffc7);
  std::unique_ptr<ExpressionNode,std::default_delete<ExpressionNode>>::
  unique_ptr<std::default_delete<ExpressionNode>,void>
            (in_stack_ffffffffffffff40,in_stack_ffffffffffffff38);
  this_00 = Tokenizer::peek(in_RSI);
  if (this_00->type == Backslash) {
    parseLambda(in_stack_00000028);
    std::unique_ptr<ExpressionNode,std::default_delete<ExpressionNode>>::operator=
              ((unique_ptr<ExpressionNode,_std::default_delete<ExpressionNode>_> *)
               this_02._M_head_impl,
               (unique_ptr<LambdaNode,_std::default_delete<LambdaNode>_> *)in_RDI);
    std::unique_ptr<LambdaNode,_std::default_delete<LambdaNode>_>::~unique_ptr
              ((unique_ptr<LambdaNode,_std::default_delete<LambdaNode>_> *)this_02._M_head_impl);
  }
  else {
    parseArithmeticExpression((Parser *)this_03);
    std::unique_ptr<ExpressionNode,_std::default_delete<ExpressionNode>_>::operator=
              ((unique_ptr<ExpressionNode,_std::default_delete<ExpressionNode>_> *)this_00,
               in_stack_ffffffffffffff38);
    std::unique_ptr<ExpressionNode,_std::default_delete<ExpressionNode>_>::~unique_ptr
              ((unique_ptr<ExpressionNode,_std::default_delete<ExpressionNode>_> *)this_00);
  }
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_ffffffffffffff80,(char *)in_stack_ffffffffffffff78,in_stack_ffffffffffffff70);
  expectToken(in_stack_ffffffffffffffd0,in_stack_ffffffffffffffcc,in_stack_ffffffffffffffc0);
  std::__cxx11::string::~string((string *)&stack0xffffffffffffff78);
  std::allocator<char>::~allocator((allocator<char> *)&stack0xffffffffffffff77);
  std::make_unique<ReturnNode,std::unique_ptr<ExpressionNode,std::default_delete<ExpressionNode>>>
            (in_stack_ffffffffffffff78);
  this_01 = std::unique_ptr<ReturnNode,_std::default_delete<ReturnNode>_>::operator->
                      ((unique_ptr<ReturnNode,_std::default_delete<ReturnNode>_> *)0x16f74a);
  Node::setMark((Node *)this_01,(Mark *)&stack0xffffffffffffffe8);
  std::unique_ptr<StatementNode,std::default_delete<StatementNode>>::
  unique_ptr<ReturnNode,std::default_delete<ReturnNode>,void>
            ((unique_ptr<StatementNode,_std::default_delete<StatementNode>_> *)this_02._M_head_impl,
             (unique_ptr<ReturnNode,_std::default_delete<ReturnNode>_> *)in_RDI);
  std::unique_ptr<ReturnNode,_std::default_delete<ReturnNode>_>::~unique_ptr
            ((unique_ptr<ReturnNode,_std::default_delete<ReturnNode>_> *)this_00);
  std::unique_ptr<ExpressionNode,_std::default_delete<ExpressionNode>_>::~unique_ptr
            ((unique_ptr<ExpressionNode,_std::default_delete<ExpressionNode>_> *)this_00);
  return (__uniq_ptr_data<StatementNode,_std::default_delete<StatementNode>,_true,_true>)
         (tuple<StatementNode_*,_std::default_delete<StatementNode>_>)this_02._M_head_impl;
}

Assistant:

std::unique_ptr<StatementNode> Parser::parseReturnStatement()
{
  const auto mark = tokenizer_.getMark();
  expectToken(TokenType::KeywordRet, "Expected return statement!");
  std::unique_ptr<ExpressionNode> value = nullptr;

  if(tokenizer_.peek().type == TokenType::Backslash)
    value = parseLambda();
  else
    value = parseArithmeticExpression();

  expectToken(TokenType::Semicolon, "Expected semicolon!");
  auto node = std::make_unique<ReturnNode>(std::move(value));
  node->setMark(mark);
  return node;
}